

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread_readout.c
# Opt level: O0

void print_mutex(char *define,pthread_mutex_t mutex)

{
  ulong local_18;
  size_t i;
  char *define_local;
  
  printf("%s { {",define);
  for (local_18 = 0; local_18 < 0x28; local_18 = local_18 + 1) {
    if (local_18 != 0) {
      printf(",");
    }
    if ((local_18 & 7) == 0) {
      printf("\\\n    ");
    }
    printf(" 0x%02hhx",(ulong)(byte)mutex.__size[local_18]);
  }
  printf(" } }\n");
  return;
}

Assistant:

static void print_mutex( const char * define, pthread_mutex_t mutex )
{
    printf( "%s { {", define );

    for ( size_t i = 0; i < sizeof( pthread_mutex_t ); ++i )
    {
        if ( i > 0 )
        {
            printf( "," );
        }

        if ( !( i % 8 ) )
        {
            printf( "\\\n    " );
        }

        printf( " 0x%02hhx", ( ( unsigned char * )&mutex )[i] );
    }

    printf( " } }\n" );
}